

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O3

void __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::BelowMinimum(GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
               *this,uint64_t actual,SValue *expected,bool exclusive)

{
  int iVar1;
  undefined7 in_register_00000009;
  ushort uVar2;
  _func_ValueType_ptr *exclusive_00;
  Data local_18;
  
  iVar1 = (int)CONCAT71(in_register_00000009,exclusive);
  uVar2 = (ushort)((actual & 0xffffffff80000000) == 0) << 5 | 0x1d6;
  if (actual >> 0x20 != 0) {
    uVar2 = (ushort)(-1 < (long)actual) << 7 | 0x116;
  }
  local_18.s.str = (Ch *)((ulong)uVar2 << 0x30);
  exclusive_00 = internal::
                 Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
                 ::GetExclusiveMinimumString;
  if (iVar1 == 0) {
    exclusive_00 = (_func_ValueType_ptr *)0x0;
  }
  local_18.n = (Number)actual;
  AddNumberError(this,iVar1 + kValidateErrorMinimum,(ValueType *)&local_18.s,expected,exclusive_00);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_18.s);
  return;
}

Assistant:

void BelowMinimum(uint64_t actual, const SValue& expected, bool exclusive) {
        AddNumberError(exclusive ? kValidateErrorExclusiveMinimum : kValidateErrorMinimum, ValueType(actual).Move(), expected,
            exclusive ? &SchemaType::GetExclusiveMinimumString : 0);
    }